

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbdrmscreen.cpp
# Opt level: O2

void __thiscall QLinuxFbDevice::createFramebuffers(QLinuxFbDevice *this)

{
  bool bVar1;
  iterator output;
  iterator iVar2;
  int i;
  int bufferIdx;
  
  output = QList<QLinuxFbDevice::Output>::begin(&this->m_outputs);
  iVar2 = QList<QLinuxFbDevice::Output>::end(&this->m_outputs);
  do {
    if (output.i == iVar2.i) {
      return;
    }
    bufferIdx = 0;
    while (bufferIdx != 2) {
      bVar1 = createFramebuffer(this,output.i,bufferIdx);
      bufferIdx = bufferIdx + 1;
      if (!bVar1) {
        return;
      }
    }
    (output.i)->backFb = 0;
    (output.i)->flipped = false;
    output.i = output.i + 1;
  } while( true );
}

Assistant:

void QLinuxFbDevice::createFramebuffers()
{
    for (Output &output : m_outputs) {
        for (int i = 0; i < BUFFER_COUNT; ++i) {
            if (!createFramebuffer(&output, i))
                return;
        }
        output.backFb = 0;
        output.flipped = false;
    }
}